

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l5.c
# Opt level: O1

int picnic3_l5_read_private_key(picnic3_l5_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  picnic_instance_t *ppVar16;
  int iVar17;
  
  iVar17 = -1;
  if ((buflen != 0 && (buf != (uint8_t *)0x0 && key != (picnic3_l5_privatekey_t *)0x0)) &&
     (*buf == '\t')) {
    ppVar16 = picnic_instance_get(Picnic3_L5);
    if ((0x60 < buflen) &&
       ((ppVar16 != (picnic_instance_t *)0x0 && (((buf[0x40] | buf[0x20] | buf[0x60]) & 1) == 0))))
    {
      uVar1 = *(undefined8 *)(buf + 1);
      uVar2 = *(undefined8 *)(buf + 9);
      uVar3 = *(undefined8 *)(buf + 0x11);
      uVar4 = *(undefined8 *)(buf + 0x19);
      uVar5 = *(undefined8 *)(buf + 0x21);
      uVar6 = *(undefined8 *)(buf + 0x29);
      uVar7 = *(undefined8 *)(buf + 0x31);
      uVar8 = *(undefined8 *)(buf + 0x39);
      uVar9 = *(undefined8 *)(buf + 0x29);
      uVar10 = *(undefined8 *)(buf + 0x31);
      uVar11 = *(undefined8 *)(buf + 0x39);
      uVar12 = *(undefined8 *)(buf + 0x41);
      uVar13 = *(undefined8 *)(buf + 0x49);
      uVar14 = *(undefined8 *)(buf + 0x51);
      uVar15 = *(undefined8 *)(buf + 0x59);
      *(undefined8 *)(key->data + 0x20) = *(undefined8 *)(buf + 0x21);
      *(undefined8 *)(key->data + 0x28) = uVar9;
      *(undefined8 *)(key->data + 0x30) = uVar10;
      *(undefined8 *)(key->data + 0x38) = uVar11;
      *(undefined8 *)(key->data + 0x40) = uVar12;
      *(undefined8 *)(key->data + 0x48) = uVar13;
      *(undefined8 *)(key->data + 0x50) = uVar14;
      *(undefined8 *)(key->data + 0x58) = uVar15;
      *(undefined8 *)key->data = uVar1;
      *(undefined8 *)(key->data + 8) = uVar2;
      *(undefined8 *)(key->data + 0x10) = uVar3;
      *(undefined8 *)(key->data + 0x18) = uVar4;
      *(undefined8 *)(key->data + 0x20) = uVar5;
      *(undefined8 *)(key->data + 0x28) = uVar6;
      *(undefined8 *)(key->data + 0x30) = uVar7;
      *(undefined8 *)(key->data + 0x38) = uVar8;
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l5_read_private_key(picnic3_l5_privatekey_t* key,
                                                            const uint8_t* buf, size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param = buf[0];
  if (param != PARAM) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  if (buflen < PRIVATE_KEY_SIZE) {
    return -1;
  }

#if (LOWMC_BLOCK_BITS & 0x7) != 0
  static const unsigned int diff = LOWMC_BLOCK_SZ * 8 - LOWMC_BLOCK_BITS;
  /* sanity check of public data: padding bits need to be 0 */
  const int check = check_padding_bits(buf[1 + LOWMC_BLOCK_SZ - 1], diff) |
                    check_padding_bits(buf[1 + 2 * LOWMC_BLOCK_SZ - 1], diff) |
                    check_padding_bits(buf[1 + 3 * LOWMC_BLOCK_SZ - 1], diff);
  picnic_declassify(&check, sizeof(check));
  if (check) {
    return -1;
  }
#endif

  memcpy(key->data, buf + 1, PRIVATE_KEY_SIZE - 1);
  return 0;
}